

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeResizeBilinearLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  Type *pTVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  ShapeRange *pSVar3;
  ResizeBilinearLayerParams *from;
  uint64 uVar4;
  uint64 uVar5;
  size_t val;
  ShapeRange local_80;
  ResizeBilinearLayerParams resize;
  
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_01,pTVar1);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&resize,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&resize);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&resize,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&resize);
  pSVar2 = ShapeConstraint::channelRange(this_01);
  pSVar3 = ShapeConstraint::channelRange(this_00);
  ShapeRange::intersect((ShapeRange *)&resize,pSVar2,pSVar3);
  ShapeConstraint::updateChannelRange(this_01,(ShapeRange *)&resize);
  from = Specification::NeuralNetworkLayer::resizebilinear(specLayer);
  Specification::ResizeBilinearLayerParams::ResizeBilinearLayerParams(&resize,from);
  if (resize.targetsize_.current_size_ == 2) {
    uVar4 = Specification::ResizeBilinearLayerParams::targetsize(&resize,0);
    if (uVar4 == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = Specification::ResizeBilinearLayerParams::targetsize(&resize,0);
    }
    uVar5 = Specification::ResizeBilinearLayerParams::targetsize(&resize,1);
    if (uVar5 == 0) {
      val = 1;
    }
    else {
      val = Specification::ResizeBilinearLayerParams::targetsize(&resize,1);
    }
  }
  else {
    val = 1;
    uVar4 = val;
  }
  ShapeConstraint::setHeight(this_01,uVar4);
  ShapeConstraint::setWidth(this_01,val);
  pSVar2 = ShapeConstraint::sequenceRange(this_00);
  pSVar3 = ShapeConstraint::sequenceRange(this_01);
  ShapeRange::intersect(&local_80,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_00,&local_80);
  pSVar2 = ShapeConstraint::batchRange(this_00);
  pSVar3 = ShapeConstraint::batchRange(this_01);
  ShapeRange::intersect(&local_80,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_00,&local_80);
  pSVar2 = ShapeConstraint::channelRange(this_00);
  pSVar3 = ShapeConstraint::channelRange(this_01);
  ShapeRange::intersect(&local_80,pSVar2,pSVar3);
  ShapeConstraint::updateChannelRange(this_00,&local_80);
  Specification::ResizeBilinearLayerParams::~ResizeBilinearLayerParams(&resize);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeResizeBilinearLayer(const Specification::NeuralNetworkLayer& specLayer) {

    // Input shape: [Seq, B, C, H_in, W_out]
    // Output shape: [Seq, B, C, H_out, W_out]

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Resize Bilinear layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Resize Bilinear layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // For forward pass: update the output shape ranges
    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));

    Specification::ResizeBilinearLayerParams resize = specLayer.resizebilinear();

    size_t target_h = 1;
    size_t target_w = 1;

    if (resize.targetsize_size() == 2) {
        target_h = (resize.targetsize(0) == 0) ? 1 : (size_t)resize.targetsize(0); //height
        target_w = (resize.targetsize(1) == 0) ? 1 : (size_t)resize.targetsize(1); //width
    }

    outputShape.setHeight(target_h);
    outputShape.setWidth(target_w);

    // For backward pass: update the input shape ranges
    inputShape.updateSequenceRange(inputShape.sequenceRange().intersect(outputShape.sequenceRange()));
    inputShape.updateBatchRange(inputShape.batchRange().intersect(outputShape.batchRange()));
    inputShape.updateChannelRange(inputShape.channelRange().intersect(outputShape.channelRange()));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Resize Bilinear layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Resize Bilinear layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}